

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_in_place(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_ADJ pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  int iVar4;
  REF_CELL pRVar5;
  REF_INT RVar6;
  long lVar7;
  REF_INT nodes [27];
  uint local_b4;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  pRVar5 = ref_grid->cell[6];
  if (0 < pRVar5->max) {
    RVar6 = 0;
    do {
      RVar2 = ref_cell_nodes(pRVar5,RVar6,local_a8);
      if ((RVar2 == 0) &&
         (uVar3 = ref_shard_add_qua_as_tri(ref_node,ref_grid->cell[3],local_a8), uVar3 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x4a6,"ref_shard_in_place",(ulong)uVar3,"add qua tri");
        return uVar3;
      }
      RVar6 = RVar6 + 1;
      pRVar5 = ref_grid->cell[6];
    } while (RVar6 < pRVar5->max);
  }
  local_b4 = ref_cell_free(pRVar5);
  if (local_b4 == 0) {
    local_b4 = ref_cell_create(ref_grid->cell + 6,REF_CELL_QUA);
    if (local_b4 == 0) {
      pRVar5 = ref_grid->cell[9];
      if (0 < pRVar5->max) {
        iVar4 = 0;
        do {
          RVar2 = ref_cell_nodes(pRVar5,iVar4,local_a8);
          if ((RVar2 == 0) &&
             (uVar3 = ref_shard_add_pyr_as_tet(ref_node,ref_grid->cell[8],local_a8,0), uVar3 != 0))
          {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x4ae,"ref_shard_in_place",(ulong)uVar3,"add pyr tet");
            return uVar3;
          }
          iVar4 = iVar4 + 1;
          pRVar5 = ref_grid->cell[9];
        } while (iVar4 < pRVar5->max);
      }
      local_b4 = ref_cell_free(pRVar5);
      if (local_b4 == 0) {
        local_b4 = ref_cell_create(ref_grid->cell + 9,REF_CELL_PYR);
        if (local_b4 == 0) {
          pRVar5 = ref_grid->cell[10];
          if (0 < pRVar5->max) {
            iVar4 = 0;
            do {
              RVar2 = ref_cell_nodes(pRVar5,iVar4,local_a8);
              if ((RVar2 == 0) &&
                 (uVar3 = ref_shard_add_pri_as_tet(ref_node,ref_grid->cell[8],local_a8,0),
                 uVar3 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x4b6,"ref_shard_in_place",(ulong)uVar3,"add pri tet");
                return uVar3;
              }
              iVar4 = iVar4 + 1;
              pRVar5 = ref_grid->cell[10];
            } while (iVar4 < pRVar5->max);
          }
          local_b4 = ref_cell_free(pRVar5);
          if (local_b4 == 0) {
            local_b4 = ref_cell_create(ref_grid->cell + 10,REF_CELL_PRI);
            if (local_b4 == 0) {
              pRVar5 = ref_grid->cell[0xb];
              if (0 < pRVar5->max) {
                RVar6 = 0;
                do {
                  RVar2 = ref_cell_nodes(pRVar5,RVar6,local_a8);
                  if ((RVar2 == 0) &&
                     (uVar3 = ref_shard_add_hex_as_tet(ref_node,ref_grid->cell[8],local_a8),
                     uVar3 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x4bd,"ref_shard_in_place",(ulong)uVar3,"add hex tet");
                    return uVar3;
                  }
                  RVar6 = RVar6 + 1;
                  pRVar5 = ref_grid->cell[0xb];
                } while (RVar6 < pRVar5->max);
              }
              local_b4 = ref_cell_free(pRVar5);
              if (local_b4 == 0) {
                local_b4 = ref_cell_create(ref_grid->cell + 0xb,REF_CELL_HEX);
                if (local_b4 == 0) {
                  if (ref_node->max < 1) {
                    local_b4 = 0;
                  }
                  else {
                    lVar7 = 0;
                    do {
                      if ((((-1 < ref_node->global[lVar7]) &&
                           ((pRVar1 = ref_grid->cell[3]->ref_adj, pRVar1->nnode <= lVar7 ||
                            (pRVar1->first[lVar7] == -1)))) &&
                          ((pRVar1 = ref_grid->cell[8]->ref_adj, pRVar1->nnode <= lVar7 ||
                           (pRVar1->first[lVar7] == -1)))) &&
                         (uVar3 = ref_node_remove_without_global(ref_node,(REF_INT)lVar7),
                         uVar3 != 0)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                               ,0x4c5,"ref_shard_in_place",(ulong)uVar3,"hanging node");
                        return uVar3;
                      }
                      lVar7 = lVar7 + 1;
                      local_b4 = 0;
                    } while (lVar7 < ref_node->max);
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x4c0,"ref_shard_in_place",(ulong)local_b4,"hex create");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x4bf,"ref_shard_in_place",(ulong)local_b4,"free hex");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x4b9,"ref_shard_in_place",(ulong)local_b4,"pri create");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x4b8,"ref_shard_in_place",(ulong)local_b4,"free pri");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x4b1,"ref_shard_in_place",(ulong)local_b4,"pyr create");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x4b0,"ref_shard_in_place",(ulong)local_b4,"free pyr");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x4a9
             ,"ref_shard_in_place",(ulong)local_b4,"qua create");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x4a8,
           "ref_shard_in_place",(ulong)local_b4,"free qua");
  }
  return local_b4;
}

Assistant:

REF_FCN REF_STATUS ref_shard_in_place(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL check_volume = REF_FALSE;

  each_ref_cell_valid_cell_with_nodes(ref_grid_qua(ref_grid), cell, nodes) {
    RSS(ref_shard_add_qua_as_tri(ref_node, ref_grid_tri(ref_grid), nodes),
        "add qua tri");
  }
  RSS(ref_cell_free(ref_grid_qua(ref_grid)), "free qua");
  RSS(ref_cell_create(&ref_grid_qua(ref_grid), REF_CELL_QUA), "qua create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_pyr(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pyr_as_tet(ref_node, ref_grid_tet(ref_grid), nodes,
                                 check_volume),
        "add pyr tet");
  }
  RSS(ref_cell_free(ref_grid_pyr(ref_grid)), "free pyr");
  RSS(ref_cell_create(&ref_grid_pyr(ref_grid), REF_CELL_PYR), "pyr create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pri_as_tet(ref_node, ref_grid_tet(ref_grid), nodes,
                                 check_volume),
        "add pri tet");
  }
  RSS(ref_cell_free(ref_grid_pri(ref_grid)), "free pri");
  RSS(ref_cell_create(&ref_grid_pri(ref_grid), REF_CELL_PRI), "pri create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_grid), cell, nodes) {
    RSS(ref_shard_add_hex_as_tet(ref_node, ref_grid_tet(ref_grid), nodes),
        "add hex tet");
  }
  RSS(ref_cell_free(ref_grid_hex(ref_grid)), "free hex");
  RSS(ref_cell_create(&ref_grid_hex(ref_grid), REF_CELL_HEX), "hex create");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node)) {
      RSS(ref_node_remove_without_global(ref_node, node), "hanging node");
    }
  }

  return REF_SUCCESS;
}